

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

bool __thiscall flexbuffers::Reference::MutateString(Reference *this,char *str,size_t len)

{
  bool bVar1;
  size_t sVar2;
  char *__dest;
  undefined1 local_40 [8];
  String s;
  size_t len_local;
  char *str_local;
  Reference *this_local;
  
  s.super_Sized.size_ = len;
  AsString((String *)local_40,this);
  bVar1 = String::IsTheEmptyString((String *)local_40);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    sVar2 = String::length((String *)local_40);
    if (sVar2 == s.super_Sized.size_) {
      __dest = String::c_str((String *)local_40);
      memcpy(__dest,str,s.super_Sized.size_);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool MutateString(const char *str, size_t len) {
    auto s = AsString();
    if (s.IsTheEmptyString()) return false;
    // This is very strict, could allow shorter strings, but that creates
    // garbage.
    if (s.length() != len) return false;
    memcpy(const_cast<char *>(s.c_str()), str, len);
    return true;
  }